

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdtrans.c
# Opt level: O0

void transdecode_master_selection(j_decompress_ptr cinfo)

{
  int local_14;
  int nscans;
  j_decompress_ptr cinfo_local;
  
  cinfo->buffered_image = 1;
  jpeg_core_output_dimensions(cinfo);
  if (cinfo->arith_code == 0) {
    jinit_huff_decoder(cinfo);
  }
  else {
    jinit_arith_decoder(cinfo);
  }
  jinit_d_coef_controller(cinfo,1);
  (*cinfo->mem->realize_virt_arrays)((j_common_ptr)cinfo);
  (*cinfo->inputctl->start_input_pass)(cinfo);
  if (cinfo->progress != (jpeg_progress_mgr *)0x0) {
    if (cinfo->progressive_mode == 0) {
      if (cinfo->inputctl->has_multiple_scans == 0) {
        local_14 = 1;
      }
      else {
        local_14 = cinfo->num_components;
      }
    }
    else {
      local_14 = cinfo->num_components * 3 + 2;
    }
    cinfo->progress->pass_counter = 0;
    cinfo->progress->pass_limit = (ulong)cinfo->total_iMCU_rows * (long)local_14;
    cinfo->progress->completed_passes = 0;
    cinfo->progress->total_passes = 1;
  }
  return;
}

Assistant:

LOCAL(void)
transdecode_master_selection (j_decompress_ptr cinfo)
{
  /* This is effectively a buffered-image operation. */
  cinfo->buffered_image = TRUE;

  /* Compute output image dimensions and related values. */
  jpeg_core_output_dimensions(cinfo);

  /* Entropy decoding: either Huffman or arithmetic coding. */
  if (cinfo->arith_code)
    jinit_arith_decoder(cinfo);
  else {
    jinit_huff_decoder(cinfo);
  }

  /* Always get a full-image coefficient buffer. */
  jinit_d_coef_controller(cinfo, TRUE);

  /* We can now tell the memory manager to allocate virtual arrays. */
  (*cinfo->mem->realize_virt_arrays) ((j_common_ptr) cinfo);

  /* Initialize input side of decompressor to consume first scan. */
  (*cinfo->inputctl->start_input_pass) (cinfo);

  /* Initialize progress monitoring. */
  if (cinfo->progress != NULL) {
    int nscans;
    /* Estimate number of scans to set pass_limit. */
    if (cinfo->progressive_mode) {
      /* Arbitrarily estimate 2 interleaved DC scans + 3 AC scans/component. */
      nscans = 2 + 3 * cinfo->num_components;
    } else if (cinfo->inputctl->has_multiple_scans) {
      /* For a nonprogressive multiscan file, estimate 1 scan per component. */
      nscans = cinfo->num_components;
    } else {
      nscans = 1;
    }
    cinfo->progress->pass_counter = 0L;
    cinfo->progress->pass_limit = (long) cinfo->total_iMCU_rows * nscans;
    cinfo->progress->completed_passes = 0;
    cinfo->progress->total_passes = 1;
  }
}